

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_queue.h
# Opt level: O3

void __thiscall
cppnet::ThreadSafeQueue<cppnet::Log_*>::Push(ThreadSafeQueue<cppnet::Log_*> *this,Log **element)

{
  iterator *piVar1;
  _Elt_pointer ppLVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->_mutex;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  ppLVar2 = (this->_queue).c.super__Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppLVar2 ==
      (this->_queue).c.super__Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<cppnet::Log*,std::allocator<cppnet::Log*>>::_M_push_back_aux<cppnet::Log*const&>
              ((deque<cppnet::Log*,std::allocator<cppnet::Log*>> *)&this->_queue,element);
  }
  else {
    *ppLVar2 = *element;
    piVar1 = &(this->_queue).c.super__Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void Push(const T& element) {
        std::unique_lock<std::mutex> lock(_mutex);
        _queue.push(element);
    }